

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbaInterfaceTiledExamples.cpp
# Opt level: O0

void writeTiledRgbaRIP1(char *fileName,int width,int height,int tileWidth,int tileHeight)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int yMax;
  Rgba *pRVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  int xLevel;
  int yLevel;
  Array2D<Imf_3_2::Rgba> pixels;
  TiledRgbaOutputFile out;
  int iVar5;
  undefined4 in_stack_ffffffffffffff14;
  Vec2<float> *this;
  int xMax;
  int in_stack_ffffffffffffff2c;
  int h;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_64;
  int local_60;
  Array2D<Imf_3_2::Rgba> local_50;
  Vec2<float> local_38;
  Rgba local_30 [6];
  
  this = &local_38;
  Imath_3_2::Vec2<float>::Vec2(this,0.0,0.0);
  uVar1 = Imf_3_2::globalThreadCount();
  h = 3;
  xMax = 0;
  iVar5 = 0;
  Imf_3_2::TiledRgbaOutputFile::TiledRgbaOutputFile
            ((TiledRgbaOutputFile *)0x3f800000,local_30,in_RDI,in_ESI,in_EDX,in_ECX,in_R8D,2,0,0xf);
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D
            ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
             ,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  pRVar4 = Imf_3_2::Array2D<Imf_3_2::Rgba>::operator[](&local_50,0);
  Imf_3_2::TiledRgbaOutputFile::setFrameBuffer(local_30,(ulong)pRVar4,1);
  local_60 = 0;
  while( true ) {
    iVar2 = Imf_3_2::TiledRgbaOutputFile::numYLevels();
    if (iVar2 <= local_60) break;
    local_64 = 0;
    while( true ) {
      iVar2 = local_64;
      iVar3 = Imf_3_2::TiledRgbaOutputFile::numXLevels();
      if (iVar3 <= iVar2) break;
      Imf_3_2::TiledRgbaOutputFile::levelWidth((int)local_30);
      iVar3 = Imf_3_2::TiledRgbaOutputFile::levelHeight((int)local_30);
      Imf_3_2::TiledRgbaOutputFile::levelWidth((int)local_30);
      yMax = Imf_3_2::TiledRgbaOutputFile::levelHeight((int)local_30);
      iVar5 = local_64;
      drawImage5((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff3c,uVar1),
                 in_stack_ffffffffffffff34,h,in_stack_ffffffffffffff2c,xMax,
                 (int)((ulong)this >> 0x20),yMax,iVar3,iVar2);
      iVar2 = Imf_3_2::TiledRgbaOutputFile::numXTiles((int)local_30);
      iVar3 = Imf_3_2::TiledRgbaOutputFile::numYTiles((int)local_30);
      Imf_3_2::TiledRgbaOutputFile::writeTiles((int)local_30,0,iVar2 + -1,0,iVar3 + -1,local_64);
      local_64 = local_64 + 1;
    }
    local_60 = local_60 + 1;
  }
  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D
            ((Array2D<Imf_3_2::Rgba> *)CONCAT44(in_stack_ffffffffffffff14,iVar5));
  Imf_3_2::TiledRgbaOutputFile::~TiledRgbaOutputFile((TiledRgbaOutputFile *)local_30);
  return;
}

Assistant:

void
writeTiledRgbaRIP1 (
    const char fileName[], int width, int height, int tileWidth, int tileHeight)
{
    //
    // Write a tiled image with ripmap levels using an image-sized framebuffer.
    //

    TiledRgbaOutputFile out (
        fileName,
        width,
        height, // image size
        tileWidth,
        tileHeight,    // tile size
        RIPMAP_LEVELS, // level mode
        ROUND_DOWN,    // rounding mode
        WRITE_RGBA);   // channels in file

    Array2D<Rgba> pixels (height, width);
    out.setFrameBuffer (&pixels[0][0], 1, width);

    for (int yLevel = 0; yLevel < out.numYLevels (); ++yLevel)
    {
        for (int xLevel = 0; xLevel < out.numXLevels (); ++xLevel)
        {
            drawImage5 (
                pixels,
                out.levelWidth (xLevel),
                out.levelHeight (yLevel),
                0,
                out.levelWidth (xLevel),
                0,
                out.levelHeight (yLevel),
                xLevel,
                yLevel);

            out.writeTiles (
                0,
                out.numXTiles (xLevel) - 1,
                0,
                out.numYTiles (yLevel) - 1,
                xLevel,
                yLevel);
        }
    }
}